

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.cpp
# Opt level: O0

void __thiscall AGSMock::Unimplemented::Unimplemented(Unimplemented *this,char *name)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *name_local;
  Unimplemented *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Unimplemented AGSMock function called: ",&local_59);
  std::operator+(&local_38,&local_58,local_18);
  std::logic_error::logic_error(&this->super_logic_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  *(undefined ***)this = &PTR__Unimplemented_0011f608;
  return;
}

Assistant:

Unimplemented::Unimplemented(const char *name)
	: logic_error(string("Unimplemented AGSMock function called: ") + name) {}